

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O2

void ewmh_init(natwm_state *state)

{
  xcb_ewmh_connection_t *pxVar1;
  __pid_t _Var2;
  xcb_window_t xVar3;
  undefined4 extraout_var;
  undefined4 uVar4;
  
  uVar4 = 0;
  _Var2 = getpid();
  pxVar1 = state->ewmh;
  vpmovsxbd_avx2(ZEXT816(0x5848403c38342c20));
  vpgatherdd_avx512vl(*(undefined4 *)((long)&pxVar1->connection + CONCAT44(extraout_var,_Var2)));
  vpmovsxwd_avx2(_DAT_0010d1e8);
  vpgatherdd_avx512vl(*(undefined4 *)((long)&pxVar1->connection + CONCAT44(extraout_var,_Var2)));
  xcb_ewmh_set_supported(pxVar1,state->screen_num,0x10);
  xcb_ewmh_set_wm_pid(state->ewmh,state->screen->root,_Var2);
  xcb_ewmh_set_wm_name(state->ewmh,state->screen->root,0xc,"natwm v0.0.1");
  xVar3 = xcb_generate_id(state->xcb);
  xcb_create_window(state->xcb,0,xVar3,state->screen->root,0xffffffffffffffff,0xffffffff,
                    CONCAT44(uVar4,1),1,0,0,state->screen->root_visual,0,0);
  ewmh_supporting_window = xVar3;
  xcb_ewmh_set_supporting_wm_check(state->ewmh,state->screen->root,xVar3);
  xcb_ewmh_set_supporting_wm_check(state->ewmh,ewmh_supporting_window);
  xcb_ewmh_set_wm_name(state->ewmh,ewmh_supporting_window,0xc,"natwm v0.0.1");
  xcb_icccm_set_wm_class(state->xcb,ewmh_supporting_window,0x1f,"supporting_window");
  xcb_ewmh_set_number_of_desktops(state->ewmh,state->screen_num,10);
  return;
}

Assistant:

void ewmh_init(const struct natwm_state *state)
{
        pid_t pid = getpid();
        size_t wm_name_len = strlen(NATWM_VERSION_STRING);

        // A list of supported atoms
        //
        // More info can be found in the spec
        // https://standards.freedesktop.org/wm-spec/wm-spec-latest.html
        xcb_atom_t net_atoms[] = {
                // Root window properties
                state->ewmh->_NET_SUPPORTED,
                state->ewmh->_NET_NUMBER_OF_DESKTOPS,
                state->ewmh->_NET_DESKTOP_VIEWPORT,
                state->ewmh->_NET_CURRENT_DESKTOP,
                state->ewmh->_NET_DESKTOP_NAMES,
                state->ewmh->_NET_ACTIVE_WINDOW,
                state->ewmh->_NET_SUPPORTING_WM_CHECK,
                // Root messages
                state->ewmh->_NET_CLOSE_WINDOW,
                state->ewmh->_NET_MOVERESIZE_WINDOW,
                state->ewmh->_NET_REQUEST_FRAME_EXTENTS,
                // Application window properties
                state->ewmh->_NET_WM_DESKTOP,
                state->ewmh->_NET_WM_WINDOW_TYPE,
                state->ewmh->_NET_WM_STATE,
                state->ewmh->_NET_WM_PID,
                // Window types
                // TODO: Add more
                state->ewmh->_NET_WM_WINDOW_TYPE_NORMAL,
                // Window States
                state->ewmh->_NET_WM_STATE_FULLSCREEN,
        };

        size_t len = (sizeof(net_atoms) / sizeof(xcb_atom_t));

        xcb_ewmh_set_supported(state->ewmh, state->screen_num, (uint32_t)len, net_atoms);

        xcb_ewmh_set_wm_pid(state->ewmh, state->screen->root, (uint32_t)pid);
        xcb_ewmh_set_wm_name(
                state->ewmh, state->screen->root, (uint32_t)wm_name_len, NATWM_VERSION_STRING);

        ewmh_supporting_window = create_supporting_window(state);

        xcb_ewmh_set_supporting_wm_check(state->ewmh, state->screen->root, ewmh_supporting_window);
        xcb_ewmh_set_supporting_wm_check(
                state->ewmh, ewmh_supporting_window, ewmh_supporting_window);

        // Set the WM name on the supporting win
        xcb_ewmh_set_wm_name(
                state->ewmh, ewmh_supporting_window, (uint32_t)wm_name_len, NATWM_VERSION_STRING);

        xcb_icccm_set_wm_class(state->xcb,
                               ewmh_supporting_window,
                               sizeof(SUPPORTING_WINDOW_CLASS_NAME),
                               SUPPORTING_WINDOW_CLASS_NAME);

        xcb_ewmh_set_number_of_desktops(
                state->ewmh, state->screen_num, (uint32_t)NATWM_WORKSPACE_COUNT);
}